

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O0

Gia_Man_t *
Gia_ManCorrSpecReduceInit
          (Gia_Man_t *p,int nFrames,int nPrefix,int fScorr,Vec_Int_t **pvOutputs,int fRings)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  Gia_Man_t *p_00;
  char *pcVar6;
  Gia_Obj_t *pGVar7;
  Vec_Int_t *pVVar8;
  Gia_Man_t *pGVar9;
  bool bVar10;
  int local_d4;
  int iObjNew;
  int iPrevNew;
  int i;
  int f;
  Vec_Int_t *vXorLits;
  Gia_Obj_t *pRepr;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  int fRings_local;
  Vec_Int_t **pvOutputs_local;
  int fScorr_local;
  int nPrefix_local;
  int nFrames_local;
  Gia_Man_t *p_local;
  
  if ((((fScorr != 0) || (nFrames < 2)) && ((fScorr == 0 || (nFrames < 1)))) && (nPrefix == 0)) {
    __assert_fail("(!fScorr && nFrames > 1) || (fScorr && nFrames > 0) || nPrefix",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecCorr.c"
                  ,0xe5,
                  "Gia_Man_t *Gia_ManCorrSpecReduceInit(Gia_Man_t *, int, int, int, Vec_Int_t **, int)"
                 );
  }
  iVar2 = Gia_ManRegNum(p);
  if (iVar2 < 1) {
    __assert_fail("Gia_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecCorr.c"
                  ,0xe6,
                  "Gia_Man_t *Gia_ManCorrSpecReduceInit(Gia_Man_t *, int, int, int, Vec_Int_t **, int)"
                 );
  }
  if (p->pReprs != (Gia_Rpr_t *)0x0) {
    iVar2 = Gia_ManObjNum(p);
    Vec_IntFill(&p->vCopies,(nFrames + nPrefix + fScorr) * iVar2,-1);
    Gia_ManSetPhase(p);
    iVar2 = Gia_ManObjNum(p);
    p_00 = Gia_ManStart((nFrames + nPrefix) * iVar2);
    pcVar6 = Abc_UtilStrsav(p->pName);
    p_00->pName = pcVar6;
    pcVar6 = Abc_UtilStrsav(p->pSpec);
    p_00->pSpec = pcVar6;
    Gia_ManHashAlloc(p_00);
    iObjNew = 0;
    while( true ) {
      iVar2 = Gia_ManRegNum(p);
      bVar10 = false;
      if (iObjNew < iVar2) {
        iVar2 = Gia_ManPiNum(p);
        pRepr = Gia_ManCi(p,iVar2 + iObjNew);
        bVar10 = pRepr != (Gia_Obj_t *)0x0;
      }
      if (!bVar10) break;
      Gia_ManAppendCi(p_00);
      Gia_ObjSetCopyF(p,0,pRepr,0);
      iObjNew = iObjNew + 1;
    }
    for (iPrevNew = 0; iPrevNew < nFrames + nPrefix + fScorr; iPrevNew = iPrevNew + 1) {
      pGVar7 = Gia_ManConst0(p);
      Gia_ObjSetCopyF(p,iPrevNew,pGVar7,0);
      iObjNew = 0;
      while( true ) {
        iVar2 = Gia_ManPiNum(p);
        bVar10 = false;
        if (iObjNew < iVar2) {
          pRepr = Gia_ManCi(p,iObjNew);
          bVar10 = pRepr != (Gia_Obj_t *)0x0;
        }
        if (!bVar10) break;
        iVar2 = Gia_ManAppendCi(p_00);
        Gia_ObjSetCopyF(p,iPrevNew,pRepr,iVar2);
        iObjNew = iObjNew + 1;
      }
    }
    pVVar8 = Vec_IntAlloc(1000);
    *pvOutputs = pVVar8;
    pVVar8 = Vec_IntAlloc(1000);
    for (iPrevNew = nPrefix; iPrevNew < nFrames + nPrefix; iPrevNew = iPrevNew + 1) {
      iObjNew = 1;
      while( true ) {
        bVar10 = false;
        if (iObjNew < p->nObjs) {
          pRepr = Gia_ManObj(p,iObjNew);
          bVar10 = pRepr != (Gia_Obj_t *)0x0;
        }
        if (!bVar10) break;
        iVar2 = Gia_ObjId(p,pRepr);
        pGVar7 = Gia_ObjReprObj(p,iVar2);
        if (pGVar7 != (Gia_Obj_t *)0x0) {
          iVar2 = Gia_ObjIsConst(p,iObjNew);
          if (iVar2 == 0) {
            local_d4 = Gia_ManCorrSpecReal(p_00,p,pGVar7,iPrevNew,nPrefix);
          }
          else {
            local_d4 = 0;
          }
          iVar2 = Gia_ManCorrSpecReal(p_00,p,pRepr,iPrevNew,nPrefix);
          uVar3 = Gia_ObjPhase(pGVar7);
          uVar4 = Gia_ObjPhase(pRepr);
          iVar2 = Abc_LitNotCond(iVar2,uVar3 ^ uVar4);
          if (local_d4 != iVar2) {
            pVVar1 = *pvOutputs;
            iVar5 = Gia_ObjId(p,pGVar7);
            Vec_IntPush(pVVar1,iVar5);
            pVVar1 = *pvOutputs;
            iVar5 = Gia_ObjId(p,pRepr);
            Vec_IntPush(pVVar1,iVar5);
            iVar2 = Gia_ManHashXor(p_00,local_d4,iVar2);
            Vec_IntPush(pVVar8,iVar2);
          }
        }
        iObjNew = iObjNew + 1;
      }
    }
    for (iObjNew = 0; iVar2 = Vec_IntSize(pVVar8), iObjNew < iVar2; iObjNew = iObjNew + 1) {
      iVar2 = Vec_IntEntry(pVVar8,iObjNew);
      Gia_ManAppendCo(p_00,iVar2);
    }
    Vec_IntFree(pVVar8);
    Gia_ManHashStop(p_00);
    Vec_IntErase(&p->vCopies);
    pGVar9 = Gia_ManCleanup(p_00);
    Gia_ManStop(p_00);
    return pGVar9;
  }
  __assert_fail("p->pReprs != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecCorr.c"
                ,0xe7,
                "Gia_Man_t *Gia_ManCorrSpecReduceInit(Gia_Man_t *, int, int, int, Vec_Int_t **, int)"
               );
}

Assistant:

Gia_Man_t * Gia_ManCorrSpecReduceInit( Gia_Man_t * p, int nFrames, int nPrefix, int fScorr, Vec_Int_t ** pvOutputs, int fRings )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pRepr;
    Vec_Int_t * vXorLits;
    int f, i, iPrevNew, iObjNew;
    assert( (!fScorr && nFrames > 1) || (fScorr && nFrames > 0) || nPrefix );
    assert( Gia_ManRegNum(p) > 0 );
    assert( p->pReprs != NULL );
    Vec_IntFill( &p->vCopies, (nFrames+nPrefix+fScorr)*Gia_ManObjNum(p), -1 );
    Gia_ManSetPhase( p );
    pNew = Gia_ManStart( (nFrames+nPrefix) * Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachRo( p, pObj, i )
    {
        Gia_ManAppendCi(pNew);
        Gia_ObjSetCopyF( p, 0, pObj, 0 );
    }
    for ( f = 0; f < nFrames+nPrefix+fScorr; f++ )
    { 
        Gia_ObjSetCopyF( p, f, Gia_ManConst0(p), 0 );
        Gia_ManForEachPi( p, pObj, i )
            Gia_ObjSetCopyF( p, f, pObj, Gia_ManAppendCi(pNew) );
    }
    *pvOutputs = Vec_IntAlloc( 1000 );
    vXorLits = Vec_IntAlloc( 1000 );
    for ( f = nPrefix; f < nFrames+nPrefix; f++ )
    {
        Gia_ManForEachObj1( p, pObj, i )
        {
            pRepr = Gia_ObjReprObj( p, Gia_ObjId(p,pObj) );
            if ( pRepr == NULL )
                continue;
            iPrevNew = Gia_ObjIsConst(p, i)? 0 : Gia_ManCorrSpecReal( pNew, p, pRepr, f, nPrefix );
            iObjNew  = Gia_ManCorrSpecReal( pNew, p, pObj, f, nPrefix );
            iObjNew  = Abc_LitNotCond( iObjNew, Gia_ObjPhase(pRepr) ^ Gia_ObjPhase(pObj) );
            if ( iPrevNew != iObjNew )
            {
                Vec_IntPush( *pvOutputs, Gia_ObjId(p, pRepr) );
                Vec_IntPush( *pvOutputs, Gia_ObjId(p, pObj) );
                Vec_IntPush( vXorLits, Gia_ManHashXor(pNew, iPrevNew, iObjNew) );
            }
        }
    }
    Vec_IntForEachEntry( vXorLits, iObjNew, i )
        Gia_ManAppendCo( pNew, iObjNew );
    Vec_IntFree( vXorLits );
    Gia_ManHashStop( pNew );
    Vec_IntErase( &p->vCopies );
//Abc_Print( 1, "Before sweeping = %d\n", Gia_ManAndNum(pNew) );
    pNew = Gia_ManCleanup( pTemp = pNew );
//Abc_Print( 1, "After sweeping = %d\n", Gia_ManAndNum(pNew) );
    Gia_ManStop( pTemp );
    return pNew;
}